

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_utils.h
# Opt level: O0

wcharstring * fromUTF8(wcharstring *__return_storage_ptr__,string *str)

{
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  *this;
  char16_t *__s;
  allocator<unsigned_short> local_a5 [13];
  undefined1 local_98 [8];
  u16string utf16;
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  convert2;
  string *str_local;
  
  this = (wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
          *)((long)&utf16.field_2 + 8);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::wstring_convert(this);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes((wide_string *)local_98,this,str);
  __s = std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
        ::data((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_98);
  std::allocator<unsigned_short>::allocator(local_a5);
  std::__cxx11::
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>::
  basic_string(__return_storage_ptr__,(unsigned_short *)__s,local_a5);
  std::allocator<unsigned_short>::~allocator(local_a5);
  std::__cxx11::u16string::~u16string((u16string *)local_98);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
                      *)((long)&utf16.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

wcharstring fromUTF8(const std::string &str)
{
    std::wstring_convert<std::codecvt_utf8<char16_t>, char16_t> convert2;
    std::u16string utf16 = convert2.from_bytes(str);
    return wcharstring((WCHAR*)utf16.data());
}